

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

real __thiscall
fasttext::ProductQuantizer::assign_centroid
          (ProductQuantizer *this,real *x,real *c0,uint8_t *code,int32_t d)

{
  real *c;
  real *prVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  real rVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  
  auVar6 = ZEXT1664(ZEXT816(0) << 0x40);
  if (0 < d) {
    uVar3 = 0;
    do {
      auVar7 = vfmadd231ss_fma(auVar6._0_16_,ZEXT416((uint)(x[uVar3] - c0[uVar3])),
                               ZEXT416((uint)(x[uVar3] - c0[uVar3])));
      auVar6 = ZEXT1664(auVar7);
      uVar3 = uVar3 + 1;
    } while ((uint)d != uVar3);
  }
  rVar5 = auVar6._0_4_;
  *code = '\0';
  iVar2 = this->ksub_;
  if (1 < iVar2) {
    prVar1 = c0 + d;
    iVar4 = 1;
    do {
      auVar7 = ZEXT816(0) << 0x40;
      if (0 < d) {
        uVar3 = 0;
        do {
          auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)(x[uVar3] - prVar1[uVar3])),
                                   ZEXT416((uint)(x[uVar3] - prVar1[uVar3])));
          uVar3 = uVar3 + 1;
        } while ((uint)d != uVar3);
      }
      if (auVar7._0_4_ < auVar6._0_4_) {
        *code = (uint8_t)iVar4;
        iVar2 = this->ksub_;
        auVar6 = ZEXT1664(auVar7);
      }
      rVar5 = auVar6._0_4_;
      iVar4 = iVar4 + 1;
      prVar1 = prVar1 + d;
    } while (iVar4 < iVar2);
  }
  return rVar5;
}

Assistant:

real ProductQuantizer::assign_centroid(
    const real* x,
    const real* c0,
    uint8_t* code,
    int32_t d) const {
  const real* c = c0;
  real dis = distL2(x, c, d);
  code[0] = 0;
  for (auto j = 1; j < ksub_; j++) {
    c += d;
    real disij = distL2(x, c, d);
    if (disij < dis) {
      code[0] = (uint8_t)j;
      dis = disij;
    }
  }
  return dis;
}